

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-test.h
# Opt level: O1

Struct * __thiscall
TypeTest::makeStruct
          (Struct *__return_storage_ptr__,TypeTest *this,TypeBuilder *builder,
          initializer_list<unsigned_long> indices)

{
  Nullability NVar1;
  long lVar2;
  Type local_68;
  Type ref;
  undefined8 uStack_58;
  FieldList fields;
  Mutability local_34;
  
  uStack_58 = 0;
  fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ref.id = (uintptr_t)__return_storage_ptr__;
  if (indices._M_len != 0) {
    lVar2 = 0;
    do {
      NVar1 = ::wasm::TypeBuilder::getTempHeapType((ulong)builder);
      local_68.id = ::wasm::TypeBuilder::getTempRefType((HeapType)builder,NVar1,Exact);
      local_34 = Mutable;
      std::vector<wasm::Field,std::allocator<wasm::Field>>::
      emplace_back<wasm::Type&,wasm::Mutability>
                ((vector<wasm::Field,std::allocator<wasm::Field>> *)&uStack_58,&local_68,&local_34);
      lVar2 = lVar2 + 8;
    } while (indices._M_len << 3 != lVar2);
  }
  *(undefined8 *)ref.id = uStack_58;
  *(pointer *)(ref.id + 8) =
       fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(ref.id + 0x10) =
       fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
       super__Vector_impl_data._M_finish;
  return (Struct *)ref.id;
}

Assistant:

wasm::Struct makeStruct(wasm::TypeBuilder& builder,
                          std::initializer_list<size_t> indices) {
    using namespace wasm;
    FieldList fields;
    for (auto index : indices) {
      Type ref = builder.getTempRefType(builder[index], Nullable);
      fields.emplace_back(ref, Mutable);
    }
    return Struct(std::move(fields));
  }